

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

void __thiscall Js::FunctionBody::SetEntryToDeferParseForDebugger(FunctionBody *this)

{
  Type *pTVar1;
  undefined1 *puVar2;
  Type TVar3;
  ProxyEntryPointInfo *pPVar4;
  Type p_Var5;
  bool bVar6;
  int iVar7;
  undefined4 *puVar8;
  FunctionInfo *pFVar9;
  undefined4 extraout_var;
  code *pcVar10;
  wchar local_78 [4];
  char16 debugStringBuffer [42];
  
  pPVar4 = (this->super_ParseableFunctionInfo).super_FunctionProxy.m_defaultEntryPointInfo.ptr;
  p_Var5 = pPVar4->jsMethod;
  if (p_Var5 != ScriptContext::ProfileModeDeferredParsingThunk &&
      p_Var5 != JavascriptFunction::DeferredParsingThunk) {
    if (((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->CurrentThunk ==
        ScriptContext::DebugProfileProbeThunk) {
      pcVar10 = ScriptContext::ProfileModeDeferredParsingThunk;
    }
    else {
      pcVar10 = JavascriptFunction::DeferredParsingThunk;
    }
    pPVar4->jsMethod = pcVar10;
    pFVar9 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    if (pFVar9 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x4e3,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar6) goto LAB_0076ac73;
      *puVar8 = 0;
      pFVar9 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    }
    if ((FunctionBody *)(pFVar9->functionBodyImpl).ptr != this) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x4e4,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                  "GetFunctionInfo()->GetFunctionProxy() == this");
      if (!bVar6) goto LAB_0076ac73;
      *puVar8 = 0;
      pFVar9 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    }
    FunctionInfo::SetOriginalEntryPoint(pFVar9,JavascriptFunction::DeferredParsingThunk);
    pFVar9 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    if (pFVar9 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x545,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar6) goto LAB_0076ac73;
      *puVar8 = 0;
      pFVar9 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    }
    if ((FunctionBody *)(pFVar9->functionBodyImpl).ptr != this) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x546,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                  "GetFunctionInfo()->GetFunctionProxy() == this");
      if (!bVar6) goto LAB_0076ac73;
      *puVar8 = 0;
      pFVar9 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    }
    TVar3 = pFVar9->attributes;
    if ((FunctionBody *)(pFVar9->functionBodyImpl).ptr != this) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x54d,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                  "GetFunctionInfo()->GetFunctionProxy() == this");
      if (!bVar6) {
LAB_0076ac73:
        pcVar10 = (code *)invalidInstructionException();
        (*pcVar10)();
      }
      *puVar8 = 0;
      pFVar9 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    }
    pFVar9->attributes = TVar3 | DeferredParse;
  }
  pTVar1 = &(this->super_ParseableFunctionInfo).flags;
  *pTVar1 = *pTVar1 & (Flags_HasRestParameter|Flags_HasNoExplicitReturnValue|
                       Flags_HasOnlyThisStatements|Flags_NonUserCode|Flags_HasThis|Flags_HasTry|
                      Flags_HasOrParentHasArguments);
  FunctionProxy::SetAuxPtr((FunctionProxy *)this,StackNestedFuncParent,(void *)0x0);
  puVar2 = &(this->super_ParseableFunctionInfo).super_FunctionProxy.field_0x47;
  *puVar2 = *puVar2 | 0x10;
  if (DAT_015bc46a == '\x01') {
    iVar7 = (*(this->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(this);
    FunctionProxy::GetDebugNumberSet((FunctionProxy *)this,(wchar (*) [42])local_78);
    Output::Trace(DebuggerPhase,
                  L"Regenerate Due To Debug Mode: function %s (%s) from script context %p\n",
                  CONCAT44(extraout_var,iVar7),(wchar (*) [42])local_78,
                  (this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext);
  }
  puVar2 = &(this->counters).field_0x1;
  *puVar2 = *puVar2 & 0xfe;
  return;
}

Assistant:

void FunctionBody::SetEntryToDeferParseForDebugger()
    {
        ProxyEntryPointInfo* defaultEntryPointInfo = this->GetDefaultEntryPointInfo();
        if (defaultEntryPointInfo->jsMethod != DefaultDeferredParsingThunk
#if defined(ENABLE_SCRIPT_PROFILING) || defined(ENABLE_SCRIPT_DEBUGGING)
            && defaultEntryPointInfo->jsMethod != ProfileDeferredParsingThunk
#endif
            )
        {
#if defined(ENABLE_SCRIPT_PROFILING) || defined(ENABLE_SCRIPT_DEBUGGING)
            // Just change the thunk, the cleanup will be done once the function gets called.
            if (this->m_scriptContext->CurrentThunk == ProfileEntryThunk)
            {
                defaultEntryPointInfo->jsMethod = ProfileDeferredParsingThunk;
            }
            else
#endif
            {
                defaultEntryPointInfo->jsMethod = DefaultDeferredParsingThunk;
            }

            this->SetOriginalEntryPoint(DefaultDeferredParsingThunk);
            this->SetAttributes((FunctionInfo::Attributes) (this->GetAttributes() | FunctionInfo::Attributes::DeferredParse));
        }

        // Set other state back to before parse as well
        this->SetStackNestedFunc(false);
        this->SetAuxPtr<AuxPointerType::StackNestedFuncParent>(nullptr);
        this->SetReparsed(true);
#if DBG
        char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
        OUTPUT_VERBOSE_TRACE(Js::DebuggerPhase, _u("Regenerate Due To Debug Mode: function %s (%s) from script context %p\n"),
            this->GetDisplayName(), this->GetDebugNumberSet(debugStringBuffer), m_scriptContext);

        this->UnlockCounters(); // assuming background jit is stopped and allow the counter setters access again
#endif
    }